

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_relation.cpp
# Opt level: O2

string * __thiscall
duckdb::UpdateRelation::ToString_abi_cxx11_
          (string *__return_storage_ptr__,UpdateRelation *this,idx_t depth)

{
  reference __lhs;
  reference this_00;
  pointer pPVar1;
  ulong __n;
  string *str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_78;
  string local_70;
  string local_50;
  
  Relation::RenderWhitespace_abi_cxx11_(&local_70,(Relation *)depth,depth);
  ::std::operator+(&local_c0,&local_70,"UPDATE ");
  ParseInfo::QualifierToString(&local_50,&this->catalog_name,&this->schema_name,&this->table_name);
  ::std::operator+(&local_a0,&local_c0,&local_50);
  ::std::operator+(__return_storage_ptr__,&local_a0," SET\n");
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_c0);
  ::std::__cxx11::string::~string((string *)&local_70);
  local_80 = &this->expressions;
  local_78 = &this->update_columns;
  for (__n = 0; __n < (ulong)((long)(this->expressions).
                                    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->expressions).
                                    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1)
  {
    __lhs = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ::get<true>(local_78,__n);
    ::std::operator+(&local_70,__lhs," = ");
    this_00 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::get<true>(local_80,__n);
    pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(this_00);
    (*(pPVar1->super_BaseExpression)._vptr_BaseExpression[8])(&local_50,pPVar1);
    ::std::operator+(&local_c0,&local_70,&local_50);
    ::std::operator+(&local_a0,&local_c0,anon_var_dwarf_3b2a754 + 8);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_a0);
    ::std::__cxx11::string::~string((string *)&local_c0);
    ::std::__cxx11::string::~string((string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_70);
  }
  if ((this->condition).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(&this->condition);
    (*(pPVar1->super_BaseExpression)._vptr_BaseExpression[8])(&local_70,pPVar1);
    ::std::operator+(&local_c0,"WHERE ",&local_70);
    ::std::operator+(&local_a0,&local_c0,anon_var_dwarf_3b2a754 + 8);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_a0);
    ::std::__cxx11::string::~string((string *)&local_c0);
    ::std::__cxx11::string::~string((string *)&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

string UpdateRelation::ToString(idx_t depth) {
	string str = RenderWhitespace(depth) + "UPDATE " +
	             ParseInfo::QualifierToString(catalog_name, schema_name, table_name) + " SET\n";
	for (idx_t i = 0; i < expressions.size(); i++) {
		str += update_columns[i] + " = " + expressions[i]->ToString() + "\n";
	}
	if (condition) {
		str += "WHERE " + condition->ToString() + "\n";
	}
	return str;
}